

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O1

ssize_t nettlp_pcie_cfg_read(nettlp_pcie_cfg *ntpc,uint16_t addr,void *buf,size_t count)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  ulong uVar4;
  ssize_t sVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  short sVar9;
  uint uVar10;
  undefined6 in_register_00000032;
  ushort uVar11;
  uint uVar12;
  int iVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  uint32_t data;
  byte local_76;
  undefined1 local_75;
  uint local_74;
  nettlp_pcie_cfg *local_70;
  int local_64;
  int local_60;
  uint local_5c;
  uint local_58;
  int local_54;
  uint local_50;
  uint local_4c;
  pollfd local_48;
  ulong local_40;
  ulong local_38;
  
  uVar10 = (uint)CONCAT62(in_register_00000032,addr);
  uVar12 = (int)count + uVar10;
  local_50 = uVar12 & 3;
  local_40 = CONCAT62(in_register_00000032,addr) >> 2;
  uVar11 = (short)(uVar12 >> 2) - (ushort)(local_50 == 0);
  uVar12 = CONCAT22((ushort)(uVar12 >> 0x12),uVar11);
  local_38 = (ulong)uVar12;
  sVar5 = 0;
  if ((ushort)local_40 <= uVar11) {
    local_64 = 4 - local_50;
    uVar10 = uVar10 & 3;
    local_60 = 4 - uVar10;
    local_40 = local_40 & 0xffff;
    local_54 = (int)local_40 - uVar12;
    local_58 = (uint)((byte)(0xf << (sbyte)uVar10) & 0xe);
    local_5c = 0xfU >> ((byte)local_64 & 0x1f) & 0xff;
    iVar1 = 0;
    iVar13 = 0;
    local_70 = ntpc;
    do {
      bVar14 = (ulong)uVar10 != 0;
      bVar15 = local_50 == 0;
      iVar8 = (int)local_40 + iVar1;
      sVar9 = (short)iVar1;
      bVar16 = sVar9 == 0;
      uVar12 = 0xf;
      if (bVar16 && bVar14) {
        uVar12 = local_58;
      }
      bVar17 = (short)((short)local_54 + sVar9) != 0;
      uVar6 = local_5c;
      if (bVar17 || bVar15) {
        uVar6 = 0x2f;
      }
      local_76 = (byte)((uint)iVar8 >> 8) & 3 | ((byte)uVar6 & (byte)uVar12) << 2;
      local_75 = (undefined1)iVar8;
      local_74 = 0;
      sVar2 = write(local_70->sockfd,&local_76,6);
      iVar8 = (int)sVar2;
      if (-1 < iVar8) {
        local_48.fd = local_70->sockfd;
        local_48.events = 1;
        iVar8 = poll(&local_48,1,1000);
        if (-1 < iVar8) {
          if (iVar8 == 0) {
            piVar3 = __errno_location();
            *piVar3 = 0x3e;
          }
          else {
            if (((byte)local_48.revents & 1) != 0) {
              sVar2 = read(local_70->sockfd,&local_76,6);
              iVar8 = (int)sVar2;
              if (-1 < iVar8) {
                local_4c = local_74 >> 0x18 | (local_74 & 0xff0000) >> 8 | (local_74 & 0xff00) << 8
                           | local_74 << 0x18;
                iVar8 = 0;
              }
              goto LAB_001033c0;
            }
            piVar3 = __errno_location();
            *piVar3 = 0x3d;
          }
          iVar8 = -1;
        }
      }
LAB_001033c0:
      if (iVar8 < 0) break;
      uVar4 = 0;
      if (bVar16 && bVar14) {
        uVar4 = (ulong)uVar10;
      }
      iVar8 = 4;
      if (bVar16 && bVar14) {
        iVar8 = local_60;
      }
      iVar7 = local_64;
      if (bVar17 || bVar15) {
        iVar7 = 0;
      }
      iVar8 = iVar8 - iVar7;
      memcpy(buf,(void *)((long)&local_4c + uVar4),(long)iVar8);
      buf = (void *)((long)buf + (long)iVar8);
      iVar13 = iVar13 + iVar8;
      iVar1 = iVar1 + 1;
      iVar8 = iVar13;
    } while ((ushort)((short)local_40 + sVar9 + 1U) <= (ushort)local_38);
    sVar5 = (ssize_t)iVar8;
  }
  return sVar5;
}

Assistant:

ssize_t nettlp_pcie_cfg_read(struct nettlp_pcie_cfg *ntpc, uint16_t addr,
			     void *buf, size_t count)
{
	int ret;
	uint16_t dwaddr;
	uint8_t mask;
	uint32_t data;
	uint8_t *ptr;

	int len, read = 0;
	uint16_t start_dwaddr, end_dwaddr;
	int fstpad;	/* unnecessary bytes in first DWORD */
	int lstpad;	/* unnecessary bytes in last DWORD */

	fstpad = addr & 0x0003;
	lstpad = 4 - ((addr + count) & 0x0003);

	start_dwaddr = addr >> 2;
	end_dwaddr = (addr + count) >> 2;
	/* A cornor case: If (addr + count) is a multple of 4, lastpad
	 * becomes 4, which means no need to read the end dword.
	 * Thus, decrement end_dwaddr and set lstpad 0.
	 */
	if (lstpad == 4) {
		lstpad = 0;
		end_dwaddr--;
	}

	for (dwaddr = start_dwaddr; dwaddr <= end_dwaddr; dwaddr++) {

		mask = 0xF;
		if (dwaddr == start_dwaddr && fstpad) {
			mask &= ((0x0F << fstpad) & 0x0F);
		}
		if (dwaddr == end_dwaddr && lstpad) {
			mask &= ((0x0F >> lstpad) & 0x0F);
		}

		ret = pcie_cfg_read_dw(ntpc, dwaddr, mask, &data);
		if (ret < 0)
			return ret;

		len = 4;
		ptr = (uint8_t *)&data;
		if (dwaddr == start_dwaddr && fstpad) {
			len -= fstpad;
			ptr += fstpad;
		}
		if (dwaddr == end_dwaddr && lstpad) {
			len -= lstpad;
		}

		memcpy(buf, ptr, len);
		buf += len;
		read += len;
	}

	return read;
}